

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

object_ptr __thiscall
mjs::interpreter::impl::create_function(impl *this,function_base *f,scope_ptr *prev_scope)

{
  gc_heap *h;
  wstring *pwVar1;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar2;
  source_extend *this_00;
  undefined8 extraout_RDX;
  object_ptr oVar3;
  allocator<wchar_t> local_89;
  wstring_view local_88;
  scope_ptr local_78 [3];
  wstring_view local_48;
  shared_ptr<mjs::block_statement> local_38;
  scope_ptr *prev_scope_local;
  function_base *f_local;
  impl *this_local;
  
  h = (gc_heap *)
      (f->body_extend_).file.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  prev_scope_local = prev_scope;
  f_local = f;
  this_local = this;
  pwVar1 = function_base::id_abi_cxx11_((function_base *)prev_scope);
  local_48 = (wstring_view)
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pwVar1);
  string::string((string *)&local_38,h,&local_48);
  pvVar2 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)function_base::block_ptr((function_base *)prev_scope_local);
  pwVar1 = (wstring *)function_base::params_abi_cxx11_((function_base *)prev_scope_local);
  this_00 = function_base::body_extend((function_base *)prev_scope_local);
  local_88 = source_extend::source_view(this_00);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)local_78,&local_88,&local_89);
  create_function(this,(string *)f,&local_38,pvVar2,pwVar1,local_78);
  std::__cxx11::wstring::~wstring((wstring *)local_78);
  std::allocator<wchar_t>::~allocator(&local_89);
  string::~string((string *)&local_38);
  oVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr create_function(const function_base& f, const scope_ptr& prev_scope) {
        return create_function(string{heap_, f.id()}, f.block_ptr(), f.params(), std::wstring{f.body_extend().source_view()}, prev_scope);
    }